

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double normal_01_cdf(double x)

{
  double dVar1;
  double dVar2;
  
  dVar2 = ABS(x);
  if (dVar2 <= 1.28) {
    dVar1 = x * 0.5 * x;
    dVar1 = 0.5 - ((dVar1 * -0.399903438504) /
                   (-29.8213557808 /
                    (48.6959930692 / (dVar1 + 5.92885724438) + dVar1 + 2.62433121679) +
                   dVar1 + 5.75885480458) + 0.398942280444) * dVar2;
  }
  else {
    dVar1 = 0.0;
    if (dVar2 <= 12.7) {
      dVar1 = exp(x * -0.5 * x);
      dVar1 = (dVar1 * 0.398942280385) /
              (1.00000615302 /
               (1.98615381364 /
                (5.29330324926 /
                 (-15.1508972451 / (30.789933034 / (dVar2 + 3.99019417011) + dVar2 + 0.742380924027)
                 + dVar2 + 4.8385912808) + dVar2 + -0.151679116635) + dVar2 + 0.000398064794) +
              dVar2 + -3.8052e-08);
    }
  }
  return (double)(-(ulong)(x < 0.0) & (ulong)dVar1 | ~-(ulong)(x < 0.0) & (ulong)(1.0 - dVar1));
}

Assistant:

double normal_01_cdf ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_01_CDF evaluates the Normal 01 CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 February 1999
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    A G Adams,
//    Areas Under the Normal Curve,
//    Algorithm 39,
//    Computer j.,
//    Volume 12, pages 197-198, 1969.
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Output, double CDF, the value of the CDF.
//
{
  double a1 = 0.398942280444;
  double a2 = 0.399903438504;
  double a3 = 5.75885480458;
  double a4 = 29.8213557808;
  double a5 = 2.62433121679;
  double a6 = 48.6959930692;
  double a7 = 5.92885724438;
  double b0 = 0.398942280385;
  double b1 = 3.8052E-08;
  double b2 = 1.00000615302;
  double b3 = 3.98064794E-04;
  double b4 = 1.98615381364;
  double b5 = 0.151679116635;
  double b6 = 5.29330324926;
  double b7 = 4.8385912808;
  double b8 = 15.1508972451;
  double b9 = 0.742380924027;
  double b10 = 30.789933034;
  double b11 = 3.99019417011;
  double cdf;
  double q;
  double y;
//
//  |X| <= 1.28.
//
  if ( fabs ( x ) <= 1.28 )
  {
    y = 0.5 * x * x;

    q = 0.5 - fabs ( x ) * ( a1 - a2 * y / ( y + a3 - a4 / ( y + a5
      + a6 / ( y + a7 ) ) ) );
//
//  1.28 < |X| <= 12.7
//
  }
  else if ( fabs ( x ) <= 12.7 )
  {
    y = 0.5 * x * x;

    q = exp ( - y ) * b0 / ( fabs ( x ) - b1
      + b2 / ( fabs ( x ) + b3
      + b4 / ( fabs ( x ) - b5
      + b6 / ( fabs ( x ) + b7
      - b8 / ( fabs ( x ) + b9
      + b10 / ( fabs ( x ) + b11 ) ) ) ) ) );
//
//  12.7 < |X|
//
  }
  else
  {
    q = 0.0;
  }
//
//  Take account of negative X.
//
  if ( x < 0.0 )
  {
    cdf = q;
  }
  else
  {
    cdf = 1.0 - q;
  }

  return cdf;
}